

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall
IsorecursiveTest_TestHeapTypeRelations_Test::TestBody
          (IsorecursiveTest_TestHeapTypeRelations_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  internal iVar68;
  byte bVar69;
  Nullability NVar70;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  HeapType b;
  HeapType b_00;
  HeapType b_01;
  HeapType b_02;
  HeapType b_03;
  HeapType b_04;
  HeapType b_05;
  HeapType b_06;
  HeapType b_07;
  HeapType b_08;
  HeapType b_09;
  HeapType b_10;
  HeapType b_11;
  HeapType b_12;
  HeapType b_13;
  HeapType b_14;
  HeapType b_15;
  HeapType b_16;
  HeapType b_17;
  HeapType b_18;
  HeapType b_19;
  HeapType b_20;
  HeapType b_21;
  HeapType b_22;
  HeapType b_23;
  HeapType b_24;
  HeapType b_25;
  HeapType b_26;
  HeapType b_27;
  HeapType b_28;
  HeapType b_29;
  HeapType b_30;
  HeapType b_31;
  HeapType b_32;
  HeapType b_33;
  HeapType b_34;
  HeapType b_35;
  HeapType b_36;
  HeapType b_37;
  HeapType b_38;
  HeapType b_39;
  HeapType b_40;
  HeapType b_41;
  HeapType b_42;
  HeapType b_43;
  HeapType b_44;
  HeapType b_45;
  HeapType b_46;
  HeapType b_47;
  HeapType b_48;
  HeapType b_49;
  HeapType b_50;
  HeapType b_51;
  HeapType b_52;
  HeapType b_53;
  HeapType b_54;
  HeapType b_55;
  HeapType b_56;
  HeapType b_57;
  HeapType b_58;
  HeapType b_59;
  HeapType b_60;
  HeapType b_61;
  HeapType b_62;
  HeapType b_63;
  HeapType b_64;
  ulong in_R8;
  char *message;
  char *in_R9;
  pointer *__ptr;
  Array AVar74;
  Array AVar75;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  initializer_list<wasm::Field> __l_01;
  initializer_list<wasm::Field> __l_02;
  initializer_list<wasm::Field> __l_03;
  initializer_list<wasm::Field> __l_04;
  initializer_list<wasm::Field> __l_05;
  initializer_list<wasm::Field> __l_06;
  initializer_list<wasm::Field> __l_07;
  initializer_list<wasm::Field> __l_08;
  optional<wasm::HeapType> lub;
  optional<wasm::HeapType> lub_00;
  optional<wasm::HeapType> lub_01;
  optional<wasm::HeapType> lub_02;
  optional<wasm::HeapType> lub_03;
  optional<wasm::HeapType> lub_04;
  optional<wasm::HeapType> lub_05;
  optional<wasm::HeapType> lub_06;
  optional<wasm::HeapType> lub_07;
  optional<wasm::HeapType> lub_08;
  optional<wasm::HeapType> lub_09;
  optional<wasm::HeapType> lub_10;
  optional<wasm::HeapType> lub_11;
  optional<wasm::HeapType> lub_12;
  optional<wasm::HeapType> lub_13;
  optional<wasm::HeapType> lub_14;
  optional<wasm::HeapType> lub_15;
  optional<wasm::HeapType> lub_16;
  optional<wasm::HeapType> lub_17;
  optional<wasm::HeapType> lub_18;
  optional<wasm::HeapType> lub_19;
  optional<wasm::HeapType> lub_20;
  optional<wasm::HeapType> lub_21;
  optional<wasm::HeapType> lub_22;
  optional<wasm::HeapType> lub_23;
  optional<wasm::HeapType> lub_24;
  optional<wasm::HeapType> lub_25;
  optional<wasm::HeapType> lub_26;
  optional<wasm::HeapType> lub_27;
  optional<wasm::HeapType> lub_28;
  optional<wasm::HeapType> lub_29;
  optional<wasm::HeapType> lub_30;
  optional<wasm::HeapType> lub_31;
  optional<wasm::HeapType> lub_32;
  optional<wasm::HeapType> lub_33;
  optional<wasm::HeapType> lub_34;
  optional<wasm::HeapType> lub_35;
  optional<wasm::HeapType> lub_36;
  optional<wasm::HeapType> lub_37;
  optional<wasm::HeapType> lub_38;
  optional<wasm::HeapType> lub_39;
  optional<wasm::HeapType> lub_40;
  optional<wasm::HeapType> lub_41;
  optional<wasm::HeapType> lub_42;
  optional<wasm::HeapType> lub_43;
  optional<wasm::HeapType> lub_44;
  optional<wasm::HeapType> lub_45;
  optional<wasm::HeapType> lub_46;
  optional<wasm::HeapType> lub_47;
  optional<wasm::HeapType> lub_48;
  optional<wasm::HeapType> lub_49;
  optional<wasm::HeapType> lub_50;
  optional<wasm::HeapType> lub_51;
  optional<wasm::HeapType> lub_52;
  optional<wasm::HeapType> lub_53;
  optional<wasm::HeapType> lub_54;
  optional<wasm::HeapType> lub_55;
  optional<wasm::HeapType> lub_56;
  optional<wasm::HeapType> lub_57;
  optional<wasm::HeapType> lub_58;
  optional<wasm::HeapType> lub_59;
  optional<wasm::HeapType> lub_60;
  optional<wasm::HeapType> lub_61;
  optional<wasm::HeapType> lub_62;
  optional<wasm::HeapType> lub_63;
  optional<wasm::HeapType> lub_64;
  optional<wasm::HeapType> lub_65;
  optional<wasm::HeapType> lub_66;
  optional<wasm::HeapType> lub_67;
  optional<wasm::HeapType> lub_68;
  optional<wasm::HeapType> lub_69;
  optional<wasm::HeapType> lub_70;
  optional<wasm::HeapType> lub_71;
  optional<wasm::HeapType> lub_72;
  optional<wasm::HeapType> lub_73;
  optional<wasm::HeapType> lub_74;
  optional<wasm::HeapType> lub_75;
  optional<wasm::HeapType> lub_76;
  optional<wasm::HeapType> lub_77;
  optional<wasm::HeapType> lub_78;
  optional<wasm::HeapType> lub_79;
  optional<wasm::HeapType> lub_80;
  optional<wasm::HeapType> lub_81;
  optional<wasm::HeapType> lub_82;
  optional<wasm::HeapType> lub_83;
  optional<wasm::HeapType> lub_84;
  optional<wasm::HeapType> lub_85;
  undefined8 local_d8;
  undefined8 local_d0;
  HeapType local_c8;
  HeapType defArray;
  Type eqref;
  Type anyref;
  HeapType defFunc;
  HeapType defStruct;
  undefined1 auStack_98 [8];
  BuildResult results;
  Type nonNullable;
  size_type local_68;
  AssertHelper local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  AssertHelper local_28;
  TypeBuilder builder;
  
  wasm::HeapType::HeapType((HeapType *)&anyref,(Signature)ZEXT816(0));
  auStack_98 = (undefined1  [8])0x0;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ = 0
  ;
  wasm::HeapType::HeapType(&defFunc,(Struct *)auStack_98);
  uVar72 = extraout_RDX;
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
    uVar72 = extraout_RDX_00;
  }
  local_d8 = 2;
  local_d0 = 0;
  AVar74.element.packedType = (int)uVar72;
  AVar74.element.mutable_ = (int)((ulong)uVar72 >> 0x20);
  AVar74.element.type.id = (uintptr_t)&local_d8;
  wasm::HeapType::HeapType(&local_c8,AVar74);
  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x0,(HeapType)0x0,lub);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x1,b,
             (optional<wasm::HeapType>)(auVar1 << 0x40));
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x2,b_00,
             (optional<wasm::HeapType>)(auVar2 << 0x40));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x3,b_01,
             (optional<wasm::HeapType>)(auVar3 << 0x40));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x4,b_02,
             (optional<wasm::HeapType>)(auVar4 << 0x40));
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x5,b_03,
             (optional<wasm::HeapType>)(auVar5 << 0x40));
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x6,b_04,
             (optional<wasm::HeapType>)(auVar6 << 0x40));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x7,b_05,
             (optional<wasm::HeapType>)(auVar7 << 0x40));
  auVar8._8_8_ = 0;
  auVar8._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x8,b_06,
             (optional<wasm::HeapType>)(auVar8 << 0x40));
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0x9,b_07,
             (optional<wasm::HeapType>)(auVar9 << 0x40));
  auVar10._8_8_ = 0;
  auVar10._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0xa,b_08,
             (optional<wasm::HeapType>)(auVar10 << 0x40));
  auVar11._8_8_ = 0;
  auVar11._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0xb,b_09,
             (optional<wasm::HeapType>)(auVar11 << 0x40));
  lub_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0xc,(HeapType)0x0,lub_00);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)0xd,b_10,
             (optional<wasm::HeapType>)(auVar12 << 0x40));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,(HeapType)anyref.id,b_11,
             (optional<wasm::HeapType>)(auVar13 << 0x40));
  auVar14._8_8_ = 0;
  auVar14._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,defFunc,b_12,(optional<wasm::HeapType>)(auVar14 << 0x40)
            );
  auVar15._8_8_ = 0;
  auVar15._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x0,local_c8,b_13,
             (optional<wasm::HeapType>)(auVar15 << 0x40));
  lub_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x1,(HeapType)0x1,lub_01);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x2,b_14,
             (optional<wasm::HeapType>)(auVar16 << 0x40));
  auVar17._8_8_ = 0;
  auVar17._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x3,b_15,
             (optional<wasm::HeapType>)(auVar17 << 0x40));
  auVar18._8_8_ = 0;
  auVar18._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x4,b_16,
             (optional<wasm::HeapType>)(auVar18 << 0x40));
  auVar19._8_8_ = 0;
  auVar19._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x5,b_17,
             (optional<wasm::HeapType>)(auVar19 << 0x40));
  auVar20._8_8_ = 0;
  auVar20._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x6,b_18,
             (optional<wasm::HeapType>)(auVar20 << 0x40));
  auVar21._8_8_ = 0;
  auVar21._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x7,b_19,
             (optional<wasm::HeapType>)(auVar21 << 0x40));
  auVar22._8_8_ = 0;
  auVar22._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x8,b_20,
             (optional<wasm::HeapType>)(auVar22 << 0x40));
  auVar23._8_8_ = 0;
  auVar23._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0x9,b_21,
             (optional<wasm::HeapType>)(auVar23 << 0x40));
  auVar24._8_8_ = 0;
  auVar24._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0xa,b_22,
             (optional<wasm::HeapType>)(auVar24 << 0x40));
  auVar25._8_8_ = 0;
  auVar25._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0xb,b_23,
             (optional<wasm::HeapType>)(auVar25 << 0x40));
  auVar26._8_8_ = 0;
  auVar26._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0xc,b_24,
             (optional<wasm::HeapType>)(auVar26 << 0x40));
  lub_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_02.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)0xd,(HeapType)0x1,lub_02);
  lub_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_03.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,(HeapType)anyref.id,(HeapType)0x1,lub_03);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,defFunc,b_25,(optional<wasm::HeapType>)(auVar27 << 0x40)
            );
  auVar28._8_8_ = 0;
  auVar28._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x1,local_c8,b_26,
             (optional<wasm::HeapType>)(auVar28 << 0x40));
  lub_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_04.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x2,(HeapType)0x2,lub_04);
  lub_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_05.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x3,(HeapType)0x2,lub_05);
  lub_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_06.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x4,(HeapType)0x2,lub_06);
  lub_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_07.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x5,(HeapType)0x2,lub_07);
  lub_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_08.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x6,(HeapType)0x2,lub_08);
  lub_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_09.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x7,(HeapType)0x2,lub_09);
  lub_10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_10.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x8,(HeapType)0x2,lub_10);
  lub_11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_11.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0x9,(HeapType)0x2,lub_11);
  lub_12.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_12.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0xa,(HeapType)0x2,lub_12);
  lub_13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_13.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0xb,(HeapType)0x2,lub_13);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0xc,b_27,
             (optional<wasm::HeapType>)(auVar29 << 0x40));
  auVar30._8_8_ = 0;
  auVar30._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)0xd,b_28,
             (optional<wasm::HeapType>)(auVar30 << 0x40));
  auVar31._8_8_ = 0;
  auVar31._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,(HeapType)anyref.id,b_29,
             (optional<wasm::HeapType>)(auVar31 << 0x40));
  lub_14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_14.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,defFunc,(HeapType)0x2,lub_14);
  lub_15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_15.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x2,local_c8,(HeapType)0x2,lub_15);
  lub_16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_16.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x3,(HeapType)0x3,lub_16);
  lub_17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_17.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x4,(HeapType)0x3,lub_17);
  lub_18.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_18.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x5,(HeapType)0x3,lub_18);
  lub_19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_19.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x6,(HeapType)0x3,lub_19);
  lub_20.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_20.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x7,(HeapType)0x2,lub_20);
  lub_21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_21.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x8,(HeapType)0x2,lub_21);
  lub_22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_22.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0x9,(HeapType)0x2,lub_22);
  lub_23.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_23.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0xa,(HeapType)0x2,lub_23);
  lub_24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_24.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0xb,(HeapType)0x3,lub_24);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0xc,b_30,
             (optional<wasm::HeapType>)(auVar32 << 0x40));
  auVar33._8_8_ = 0;
  auVar33._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)0xd,b_31,
             (optional<wasm::HeapType>)(auVar33 << 0x40));
  auVar34._8_8_ = 0;
  auVar34._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,(HeapType)anyref.id,b_32,
             (optional<wasm::HeapType>)(auVar34 << 0x40));
  lub_25.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_25.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,defFunc,(HeapType)0x3,lub_25);
  lub_26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_26.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x3,local_c8,(HeapType)0x3,lub_26);
  lub_27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_27.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0x4,(HeapType)0x4,lub_27);
  lub_28.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_28.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0x5,(HeapType)0x3,lub_28);
  lub_29.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_29.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0x6,(HeapType)0x3,lub_29);
  lub_30.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_30.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0x7,(HeapType)0x2,lub_30);
  lub_31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_31.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0x8,(HeapType)0x2,lub_31);
  lub_32.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_32.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0x9,(HeapType)0x2,lub_32);
  lub_33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_33.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0xa,(HeapType)0x2,lub_33);
  lub_34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_34.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0xb,(HeapType)0x4,lub_34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0xc,b_33,
             (optional<wasm::HeapType>)(auVar35 << 0x40));
  auVar36._8_8_ = 0;
  auVar36._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)0xd,b_34,
             (optional<wasm::HeapType>)(auVar36 << 0x40));
  auVar37._8_8_ = 0;
  auVar37._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,(HeapType)anyref.id,b_35,
             (optional<wasm::HeapType>)(auVar37 << 0x40));
  lub_35.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_35.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,defFunc,(HeapType)0x3,lub_35);
  lub_36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_36.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x4,local_c8,(HeapType)0x3,lub_36);
  lub_37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_37.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0x5,(HeapType)0x5,lub_37);
  lub_38.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_38.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0x6,(HeapType)0x3,lub_38);
  lub_39.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_39.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0x7,(HeapType)0x2,lub_39);
  lub_40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0x8,(HeapType)0x2,lub_40);
  lub_41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_41.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0x9,(HeapType)0x2,lub_41);
  lub_42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0xa,(HeapType)0x2,lub_42);
  lub_43.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_43.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0xb,(HeapType)0x5,lub_43);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0xc,b_36,
             (optional<wasm::HeapType>)(auVar38 << 0x40));
  auVar39._8_8_ = 0;
  auVar39._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)0xd,b_37,
             (optional<wasm::HeapType>)(auVar39 << 0x40));
  auVar40._8_8_ = 0;
  auVar40._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,(HeapType)anyref.id,b_38,
             (optional<wasm::HeapType>)(auVar40 << 0x40));
  lub_44.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_44.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,defFunc,(HeapType)0x5,lub_44);
  lub_45.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_45.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000005,local_c8,(HeapType)0x3,lub_45);
  lub_46.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_46.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0x6,(HeapType)0x6,lub_46);
  lub_47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_47.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0x7,(HeapType)0x2,lub_47);
  lub_48.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_48.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0x8,(HeapType)0x2,lub_48);
  lub_49.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_49.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0x9,(HeapType)0x2,lub_49);
  lub_50.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_50.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0xa,(HeapType)0x2,lub_50);
  lub_51.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_51.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0xb,(HeapType)0x6,lub_51);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0xc,b_39,
             (optional<wasm::HeapType>)(auVar41 << 0x40));
  auVar42._8_8_ = 0;
  auVar42._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)0xd,b_40,
             (optional<wasm::HeapType>)(auVar42 << 0x40));
  auVar43._8_8_ = 0;
  auVar43._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,(HeapType)anyref.id,b_41,
             (optional<wasm::HeapType>)(auVar43 << 0x40));
  lub_52.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_52.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,defFunc,(HeapType)0x3,lub_52);
  lub_53.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_53.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_00000006,local_c8,(HeapType)0x6,lub_53);
  lub_54.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_54.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0x7,(HeapType)0x7,lub_54);
  lub_55.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_55.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0x8,(HeapType)0x2,lub_55);
  lub_56.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_56.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0x9,(HeapType)0x2,lub_56);
  lub_57.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_57.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0xa,(HeapType)0x2,lub_57);
  lub_58.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_58.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0xb,(HeapType)0x7,lub_58);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0xc,b_42,
             (optional<wasm::HeapType>)(auVar44 << 0x40));
  auVar45._8_8_ = 0;
  auVar45._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)0xd,b_43,
             (optional<wasm::HeapType>)(auVar45 << 0x40));
  auVar46._8_8_ = 0;
  auVar46._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,(HeapType)anyref.id,b_44,
             (optional<wasm::HeapType>)(auVar46 << 0x40));
  lub_59.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_59.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,defFunc,(HeapType)0x2,lub_59);
  lub_60.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_60.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x7,local_c8,(HeapType)0x2,lub_60);
  lub_61.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_61.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)0x8,(HeapType)0x8,lub_61);
  lub_62.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_62.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)0x9,(HeapType)0x2,lub_62);
  lub_63.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_63.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)0xa,(HeapType)0x2,lub_63);
  lub_64.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_64.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)0xb,(HeapType)0x8,lub_64);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)0xc,b_45,
             (optional<wasm::HeapType>)(auVar47 << 0x40));
  auVar48._8_8_ = 0;
  auVar48._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)0xd,b_46,
             (optional<wasm::HeapType>)(auVar48 << 0x40));
  auVar49._8_8_ = 0;
  auVar49._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,(HeapType)anyref.id,b_47,
             (optional<wasm::HeapType>)(auVar49 << 0x40));
  lub_65.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_65.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,defFunc,(HeapType)0x2,lub_65);
  lub_66.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_66.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x8,local_c8,(HeapType)0x2,lub_66);
  lub_67.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_67.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(HeapType)0x9,(HeapType)0x9,lub_67);
  lub_68.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_68.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(HeapType)0xa,(HeapType)0x2,lub_68);
  lub_69.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_69.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(HeapType)0xb,(HeapType)0x9,lub_69);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(HeapType)0xc,b_48,
             (optional<wasm::HeapType>)(auVar50 << 0x40));
  auVar51._8_8_ = 0;
  auVar51._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(HeapType)0xd,b_49,
             (optional<wasm::HeapType>)(auVar51 << 0x40));
  auVar52._8_8_ = 0;
  auVar52._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,(HeapType)anyref.id,b_50,
             (optional<wasm::HeapType>)(auVar52 << 0x40));
  lub_70.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_70.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,defFunc,(HeapType)0x2,lub_70);
  lub_71.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_71.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0x9,local_c8,(HeapType)0x2,lub_71);
  lub_72.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_72.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,(HeapType)0xa,(HeapType)0xa,lub_72);
  lub_73.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_73.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,(HeapType)0xb,(HeapType)0xa,lub_73);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,(HeapType)0xc,b_51,
             (optional<wasm::HeapType>)(auVar53 << 0x40));
  auVar54._8_8_ = 0;
  auVar54._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,(HeapType)0xd,b_52,
             (optional<wasm::HeapType>)(auVar54 << 0x40));
  auVar55._8_8_ = 0;
  auVar55._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,(HeapType)anyref.id,b_53,
             (optional<wasm::HeapType>)(auVar55 << 0x40));
  lub_74.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_74.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,defFunc,(HeapType)0x2,lub_74);
  lub_75.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_75.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000a,local_c8,(HeapType)0x2,lub_75);
  lub_76.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_76.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xb,(HeapType)0xb,(HeapType)0xb,lub_76);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xb,(HeapType)0xc,b_54,
             (optional<wasm::HeapType>)(auVar56 << 0x40));
  auVar57._8_8_ = 0;
  auVar57._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xb,(HeapType)0xd,b_55,
             (optional<wasm::HeapType>)(auVar57 << 0x40));
  auVar58._8_8_ = 0;
  auVar58._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xb,(HeapType)anyref.id,b_56,
             (optional<wasm::HeapType>)(auVar58 << 0x40));
  lub_77.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_77.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xb,defFunc,defFunc,lub_77);
  lub_78.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_78.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xb,local_c8,local_c8,lub_78);
  lub_79.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_79.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xc,(HeapType)0xc,(HeapType)0xc,lub_79);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xc,(HeapType)0xd,b_57,
             (optional<wasm::HeapType>)(auVar59 << 0x40));
  auVar60._8_8_ = 0;
  auVar60._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xc,(HeapType)anyref.id,b_58,
             (optional<wasm::HeapType>)(auVar60 << 0x40));
  auVar61._8_8_ = 0;
  auVar61._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xc,defFunc,b_59,(optional<wasm::HeapType>)(auVar61 << 0x40)
            );
  auVar62._8_8_ = 0;
  auVar62._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xc,local_c8,b_60,
             (optional<wasm::HeapType>)(auVar62 << 0x40));
  lub_80.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_80.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000d,(HeapType)0xd,(HeapType)0xd,lub_80);
  lub_81.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_81.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000d,(HeapType)anyref.id,(HeapType)anyref.id,lub_81
            );
  auVar63._8_8_ = 0;
  auVar63._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000d,defFunc,b_61,
             (optional<wasm::HeapType>)(auVar63 << 0x40));
  auVar64._8_8_ = 0;
  auVar64._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&DAT_0000000d,local_c8,b_62,
             (optional<wasm::HeapType>)(auVar64 << 0x40));
  lub_82.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_82.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)anyref.id,(HeapType)anyref.id,(HeapType)anyref.id,lub_82);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)anyref.id,defFunc,b_63,
             (optional<wasm::HeapType>)(auVar65 << 0x40));
  auVar66._8_8_ = 0;
  auVar66._0_8_ = in_R8;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)anyref.id,local_c8,b_64,
             (optional<wasm::HeapType>)(auVar66 << 0x40));
  lub_83.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_83.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)defFunc.id,(HeapType)defFunc.id,(HeapType)defFunc.id,lub_83)
  ;
  lub_84.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_84.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)defFunc.id,local_c8,(HeapType)0x3,lub_84);
  lub_85.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._8_8_ = in_R8;
  lub_85.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload = (_Storage<wasm::HeapType,_true>)0x1;
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)local_c8.id,(HeapType)local_c8.id,(HeapType)local_c8.id,
             lub_85);
  wasm::Type::Type(&eqref,(HeapType)0x2,Nullable);
  wasm::Type::Type((Type *)&defArray,(HeapType)0x3,Nullable);
  wasm::Type::Type((Type *)&results.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._M_index,(HeapType)0x2,NonNullable);
  iVar68 = (internal)
           wasm::Type::isSubType
                     ((Type)results.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._24_8_,eqref);
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48[0] = iVar68;
  if (iVar68 == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_98,(internal *)local_48,
               (AssertionResult *)"Type::isSubType(nonNullable, anyref)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f6,(char *)auStack_98);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (auStack_98 !=
        (undefined1  [8])
        ((long)&results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_u + 8)) {
      operator_delete((void *)auStack_98,
                      results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._M_u._8_8_ + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_40,pbStack_40);
    }
  }
  bVar69 = wasm::Type::isSubType
                     (eqref,(Type)results.
                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  ._24_8_);
  local_48[0] = (internal)(bVar69 ^ 1);
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_98,(internal *)local_48,
               (AssertionResult *)"Type::isSubType(anyref, nonNullable)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f7,(char *)auStack_98);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (auStack_98 !=
        (undefined1  [8])
        ((long)&results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_u + 8)) {
      operator_delete((void *)auStack_98,
                      results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._M_u._8_8_ + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_40,pbStack_40);
    }
  }
  local_48[0] = (internal)
                wasm::Type::hasLeastUpperBound
                          (eqref,(Type)results.
                                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       ._24_8_);
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_98,(internal *)local_48,
               (AssertionResult *)"Type::hasLeastUpperBound(anyref, nonNullable)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f8,(char *)auStack_98);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (auStack_98 !=
        (undefined1  [8])
        ((long)&results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_u + 8)) {
      operator_delete((void *)auStack_98,
                      results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._M_u._8_8_ + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_40,pbStack_40);
    }
  }
  local_48 = (undefined1  [8])
             wasm::Type::getLeastUpperBound
                       (eqref,(Type)results.
                                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    ._24_8_);
  testing::internal::CmpHelperEQ<wasm::Type,wasm::Type>
            ((internal *)auStack_98,"Type::getLeastUpperBound(anyref, nonNullable)","anyref",
             (Type *)local_48,&eqref);
  if ((internal)auStack_98[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_48);
    if (results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)results.
                          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          ._M_u._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x2f9,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_48 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_48 + 8))();
    }
  }
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_
      != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&results,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 results.
                 super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .
                 super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                 .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                 super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                 ._M_u._0_8_);
  }
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,2);
  auStack_98 = (undefined1  [8])eqref.id;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auStack_98;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Array)(auVar67 << 0x40));
  auStack_98 = (undefined1  [8])defArray.id;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  AVar75.element._8_8_ = auStack_98;
  AVar75.element.type.id = 1;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,AVar75);
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
  wasm::TypeBuilder::build();
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] == '\0';
  nonNullable.id = 0;
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] != '\0') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,
               (internal *)
               &results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,(AssertionResult *)"results","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x303,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (nonNullable.id != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&nonNullable,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   nonNullable.id);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _16_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)local_48,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_98);
    goto LAB_0014dbe9;
  }
  pvVar71 = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)auStack_98);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &results.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_index,pvVar71);
  local_60.data_._0_1_ =
       (internal)
       wasm::HeapType::isSubType
                 ((HeapType)
                  *(uintptr_t *)
                   (results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._24_8_ + 8),
                  (HeapType)
                  *(uintptr_t *)
                   results.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._24_8_);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&defStruct,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x305,(char *)local_48);
    testing::internal::AssertHelper::operator=((AssertHelper *)&defStruct,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&defStruct);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ !=
      0) {
    operator_delete((void *)results.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._24_8_,
                    local_68 -
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._24_8_);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [results.
     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_
     & 0xff]._M_data)((anon_class_1_0_00000001 *)local_48,
                      (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)auStack_98);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,2);
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       eqref.id;
  nonNullable.id = 0;
  __l._M_len = 1;
  __l._M_array = (iterator)
                 &results.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._M_index;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       defArray.id;
  nonNullable.id = 0;
  __l_00._M_len = 1;
  __l_00._M_array =
       (iterator)
       &results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
  ;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_00,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x1);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
  wasm::TypeBuilder::build();
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] == '\0';
  nonNullable.id = 0;
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] != '\0') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,
               (internal *)
               &results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,(AssertionResult *)"results","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x30f,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (nonNullable.id != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&nonNullable,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   nonNullable.id);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _16_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)local_48,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_98);
    goto LAB_0014dbe9;
  }
  pvVar71 = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)auStack_98);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &results.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_index,pvVar71);
  local_60.data_._0_1_ =
       (internal)
       wasm::HeapType::isSubType
                 ((HeapType)
                  *(uintptr_t *)
                   (results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._24_8_ + 8),
                  (HeapType)
                  *(uintptr_t *)
                   results.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._24_8_);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&defStruct,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x311,(char *)local_48);
    testing::internal::AssertHelper::operator=((AssertHelper *)&defStruct,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&defStruct);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ !=
      0) {
    operator_delete((void *)results.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._24_8_,
                    local_68 -
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._24_8_);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [results.
     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_
     & 0xff]._M_data)((anon_class_1_0_00000001 *)local_48,
                      (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)auStack_98);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,2);
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       eqref.id;
  nonNullable.id = 0;
  __l_01._M_len = 1;
  __l_01._M_array =
       (iterator)
       &results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
  ;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_01,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  auStack_98 = (undefined1  [8])eqref.id;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ = 0
  ;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       eqref.id;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_ =
       0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)auStack_98;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
             &results.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_index,__l_02,(allocator_type *)&local_60);
  local_48 = (undefined1  [8])
             results.
             super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
             .
             super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
             .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
             _24_8_;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)nonNullable.id;
  local_38._M_allocated_capacity = local_68;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       '\0';
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ = 0;
  nonNullable.id = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x1);
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ !=
      0) {
    operator_delete((void *)results.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._24_8_,
                    -results.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._24_8_);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
  wasm::TypeBuilder::build();
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] == '\0';
  nonNullable.id = 0;
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] != '\0') {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,
               (internal *)
               &results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,(AssertionResult *)"results","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x31b,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (nonNullable.id != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&nonNullable,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   nonNullable.id);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _16_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)local_48,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_98);
    goto LAB_0014dbe9;
  }
  pvVar71 = std::
            get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                      ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                        *)auStack_98);
  std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
            ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
             &results.
              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .
              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
              _M_index,pvVar71);
  local_60.data_._0_1_ =
       (internal)
       wasm::HeapType::isSubType
                 ((HeapType)
                  *(uintptr_t *)
                   (results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._24_8_ + 8),
                  (HeapType)
                  *(uintptr_t *)
                   results.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._24_8_);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_60.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,
               (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&defStruct,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x31d,(char *)local_48);
    testing::internal::AssertHelper::operator=((AssertHelper *)&defStruct,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&defStruct);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if (local_50.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_50.data_ + 8))();
    }
    if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_58,local_58);
    }
  }
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ !=
      0) {
    operator_delete((void *)results.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._24_8_,
                    -results.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._24_8_);
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr
    [results.
     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .
     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
     .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_
     & 0xff]._M_data)((anon_class_1_0_00000001 *)local_48,
                      (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)auStack_98);
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
  wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,4);
  NVar70 = wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  uVar72 = wasm::TypeBuilder::getTempRefType((HeapType)&local_28,NVar70);
  NVar70 = wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  uVar73 = wasm::TypeBuilder::getTempRefType((HeapType)&local_28,NVar70);
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       eqref.id;
  nonNullable.id = 0;
  __l_03._M_len = 1;
  __l_03._M_array =
       (iterator)
       &results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
  ;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_03,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       defArray.id;
  nonNullable.id = 0;
  __l_04._M_len = 1;
  __l_04._M_array =
       (iterator)
       &results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
  ;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_04,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x1);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  nonNullable.id = 0;
  __l_05._M_len = 1;
  __l_05._M_array =
       (iterator)
       &results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
  ;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       uVar72;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_05,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x2);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  nonNullable.id = 0;
  __l_06._M_len = 1;
  __l_06._M_array =
       (iterator)
       &results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
  ;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       uVar73;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_06,
             (allocator_type *)&local_60);
  auStack_98 = local_48;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
       pbStack_40;
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
       local_38._M_allocated_capacity;
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x3);
  if (auStack_98 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_98,
                    results.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._8_8_ - (long)auStack_98);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
  wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
  wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x3);
  wasm::TypeBuilder::build();
  results.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
       results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _M_first._M_storage._M_storage[0x10] == '\0';
  nonNullable.id = 0;
  if (results.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
      _M_first._M_storage._M_storage[0x10] == '\0') {
    pvVar71 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)auStack_98);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,pvVar71);
    local_60.data_._0_1_ =
         (internal)
         wasm::HeapType::isSubType
                   ((HeapType)
                    *(uintptr_t *)
                     (results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._24_8_ + 0x18),
                    (HeapType)
                    *(uintptr_t *)
                     (results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._24_8_ + 0x10));
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_60.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)&local_60,
                 (AssertionResult *)"HeapType::isSubType(built[3], built[2])","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&defStruct,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x32e,(char *)local_48);
      testing::internal::AssertHelper::operator=((AssertHelper *)&defStruct,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&defStruct);
      if (local_48 != (undefined1  [8])&local_38) {
        operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
    }
    if (results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
        != 0) {
      operator_delete((void *)results.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              ._24_8_,
                      -results.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       ._24_8_);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [results.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _16_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)local_48,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_98);
    wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
    wasm::TypeBuilder::TypeBuilder((TypeBuilder *)&local_28,2);
    NVar70 = wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
    uVar72 = wasm::TypeBuilder::getTempRefType((HeapType)&local_28,NVar70);
    NVar70 = wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
    uVar73 = wasm::TypeBuilder::getTempRefType((HeapType)&local_28,NVar70);
    nonNullable.id = 0;
    __l_07._M_len = 1;
    __l_07._M_array =
         (iterator)
         &results.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          _M_index;
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         uVar72;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_07,
               (allocator_type *)&local_60);
    auStack_98 = local_48;
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         pbStack_40;
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
         local_38._M_allocated_capacity;
    local_48 = (undefined1  [8])0x0;
    pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_38._M_allocated_capacity = 0;
    wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x0);
    if (auStack_98 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_98,
                      results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._M_u._8_8_ - (long)auStack_98);
    }
    if (local_48 != (undefined1  [8])0x0) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
    }
    nonNullable.id = 0;
    __l_08._M_len = 1;
    __l_08._M_array =
         (iterator)
         &results.
          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .
          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
          .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
          _M_index;
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         uVar73;
    std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
              ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)local_48,__l_08,
               (allocator_type *)&local_60);
    auStack_98 = local_48;
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         pbStack_40;
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
         local_38._M_allocated_capacity;
    local_48 = (undefined1  [8])0x0;
    pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_38._M_allocated_capacity = 0;
    wasm::TypeBuilder::setHeapType((ulong)&local_28,(Struct *)0x1);
    if (auStack_98 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_98,
                      results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._M_u._8_8_ - (long)auStack_98);
    }
    if (local_48 != (undefined1  [8])0x0) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity - (long)local_48);
    }
    wasm::TypeBuilder::getTempHeapType((ulong)&local_28);
    wasm::TypeBuilder::setSubType((ulong)&local_28,(HeapType)0x1);
    wasm::TypeBuilder::build();
    results.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index =
         results.
         super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
         .
         super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
         .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
         super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
         _M_first._M_storage._M_storage[0x10] == '\0';
    nonNullable.id = 0;
    if (results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] != '\0') {
      testing::Message::Message((Message *)&local_60);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,
                 (internal *)
                 &results.
                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .
                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                  ._M_index,(AssertionResult *)"results","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x33a,(char *)local_48);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
      goto LAB_0014db9b;
    }
    pvVar71 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)auStack_98);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,pvVar71);
    local_60.data_._0_1_ =
         (internal)
         wasm::HeapType::isSubType
                   ((HeapType)
                    *(uintptr_t *)
                     (results.
                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      .
                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      .
                      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      ._24_8_ + 8),
                    (HeapType)
                    *(uintptr_t *)
                     results.
                     super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                     .
                     super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .
                     super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                     super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                     ._24_8_);
    local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_60.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_48,(internal *)&local_60,
                 (AssertionResult *)"HeapType::isSubType(built[1], built[0])","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&defStruct,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x33c,(char *)local_48);
      testing::internal::AssertHelper::operator=((AssertHelper *)&defStruct,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&defStruct);
      if (local_48 != (undefined1  [8])&local_38) {
        operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
      }
      if (local_50.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_58,local_58);
      }
    }
    if (results.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_
        != 0) {
      operator_delete((void *)results.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              ._24_8_,
                      -results.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       ._24_8_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,
               (internal *)
               &results.
                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .
                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                _M_index,(AssertionResult *)"results","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x32c,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_60);
LAB_0014db9b:
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_60.data_._1_7_,local_60.data_._0_1_) + 8))();
    }
    if (nonNullable.id != 0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&nonNullable,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   nonNullable.id);
    }
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       *)auStack_98);
LAB_0014dbe9:
  wasm::TypeBuilder::~TypeBuilder((TypeBuilder *)&local_28);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, TestHeapTypeRelations) {
  HeapType ext = HeapType::ext;
  HeapType func = HeapType::func;
  HeapType any = HeapType::any;
  HeapType eq = HeapType::eq;
  HeapType i31 = HeapType::i31;
  HeapType struct_ = HeapType::struct_;
  HeapType array = HeapType::array;
  HeapType string = HeapType::string;
  HeapType stringview_wtf8 = HeapType::stringview_wtf8;
  HeapType stringview_wtf16 = HeapType::stringview_wtf16;
  HeapType stringview_iter = HeapType::stringview_iter;
  HeapType none = HeapType::none;
  HeapType noext = HeapType::noext;
  HeapType nofunc = HeapType::nofunc;
  HeapType defFunc = Signature();
  HeapType defStruct = Struct();
  HeapType defArray = Array(Field(Type::i32, Immutable));

  auto assertLUB = [](HeapType a, HeapType b, std::optional<HeapType> lub) {
    auto lub1 = HeapType::getLeastUpperBound(a, b);
    auto lub2 = HeapType::getLeastUpperBound(b, a);
    EXPECT_EQ(lub, lub1);
    EXPECT_EQ(lub1, lub2);
    if (a == b) {
      EXPECT_TRUE(HeapType::isSubType(a, b));
      EXPECT_TRUE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else if (lub && *lub == b) {
      EXPECT_TRUE(HeapType::isSubType(a, b));
      EXPECT_FALSE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else if (lub && *lub == a) {
      EXPECT_FALSE(HeapType::isSubType(a, b));
      EXPECT_TRUE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else if (lub) {
      EXPECT_FALSE(HeapType::isSubType(a, b));
      EXPECT_FALSE(HeapType::isSubType(b, a));
      EXPECT_EQ(a.getBottom(), b.getBottom());
    } else {
      EXPECT_FALSE(HeapType::isSubType(a, b));
      EXPECT_FALSE(HeapType::isSubType(b, a));
      EXPECT_NE(a.getBottom(), b.getBottom());
    }
  };

  assertLUB(ext, ext, ext);
  assertLUB(ext, func, {});
  assertLUB(ext, any, {});
  assertLUB(ext, eq, {});
  assertLUB(ext, i31, {});
  assertLUB(ext, struct_, {});
  assertLUB(ext, array, {});
  assertLUB(ext, string, {});
  assertLUB(ext, stringview_wtf8, {});
  assertLUB(ext, stringview_wtf16, {});
  assertLUB(ext, stringview_iter, {});
  assertLUB(ext, none, {});
  assertLUB(ext, noext, ext);
  assertLUB(ext, nofunc, {});
  assertLUB(ext, defFunc, {});
  assertLUB(ext, defStruct, {});
  assertLUB(ext, defArray, {});

  assertLUB(func, func, func);
  assertLUB(func, any, {});
  assertLUB(func, eq, {});
  assertLUB(func, i31, {});
  assertLUB(func, struct_, {});
  assertLUB(func, array, {});
  assertLUB(func, string, {});
  assertLUB(func, stringview_wtf8, {});
  assertLUB(func, stringview_wtf16, {});
  assertLUB(func, stringview_iter, {});
  assertLUB(func, none, {});
  assertLUB(func, noext, {});
  assertLUB(func, nofunc, func);
  assertLUB(func, defFunc, func);
  assertLUB(func, defStruct, {});
  assertLUB(func, defArray, {});

  assertLUB(any, any, any);
  assertLUB(any, eq, any);
  assertLUB(any, i31, any);
  assertLUB(any, struct_, any);
  assertLUB(any, array, any);
  assertLUB(any, string, any);
  assertLUB(any, stringview_wtf8, any);
  assertLUB(any, stringview_wtf16, any);
  assertLUB(any, stringview_iter, any);
  assertLUB(any, none, any);
  assertLUB(any, noext, {});
  assertLUB(any, nofunc, {});
  assertLUB(any, defFunc, {});
  assertLUB(any, defStruct, any);
  assertLUB(any, defArray, any);

  assertLUB(eq, eq, eq);
  assertLUB(eq, i31, eq);
  assertLUB(eq, struct_, eq);
  assertLUB(eq, array, eq);
  assertLUB(eq, string, any);
  assertLUB(eq, stringview_wtf8, any);
  assertLUB(eq, stringview_wtf16, any);
  assertLUB(eq, stringview_iter, any);
  assertLUB(eq, none, eq);
  assertLUB(eq, noext, {});
  assertLUB(eq, nofunc, {});
  assertLUB(eq, defFunc, {});
  assertLUB(eq, defStruct, eq);
  assertLUB(eq, defArray, eq);

  assertLUB(i31, i31, i31);
  assertLUB(i31, struct_, eq);
  assertLUB(i31, array, eq);
  assertLUB(i31, string, any);
  assertLUB(i31, stringview_wtf8, any);
  assertLUB(i31, stringview_wtf16, any);
  assertLUB(i31, stringview_iter, any);
  assertLUB(i31, none, i31);
  assertLUB(i31, noext, {});
  assertLUB(i31, nofunc, {});
  assertLUB(i31, defFunc, {});
  assertLUB(i31, defStruct, eq);
  assertLUB(i31, defArray, eq);

  assertLUB(struct_, struct_, struct_);
  assertLUB(struct_, array, eq);
  assertLUB(struct_, string, any);
  assertLUB(struct_, stringview_wtf8, any);
  assertLUB(struct_, stringview_wtf16, any);
  assertLUB(struct_, stringview_iter, any);
  assertLUB(struct_, none, struct_);
  assertLUB(struct_, noext, {});
  assertLUB(struct_, nofunc, {});
  assertLUB(struct_, defFunc, {});
  assertLUB(struct_, defStruct, struct_);
  assertLUB(struct_, defArray, eq);

  assertLUB(array, array, array);
  assertLUB(array, string, any);
  assertLUB(array, stringview_wtf8, any);
  assertLUB(array, stringview_wtf16, any);
  assertLUB(array, stringview_iter, any);
  assertLUB(array, none, array);
  assertLUB(array, noext, {});
  assertLUB(array, nofunc, {});
  assertLUB(array, defFunc, {});
  assertLUB(array, defStruct, eq);
  assertLUB(array, defArray, array);

  assertLUB(string, string, string);
  assertLUB(string, stringview_wtf8, any);
  assertLUB(string, stringview_wtf16, any);
  assertLUB(string, stringview_iter, any);
  assertLUB(string, none, string);
  assertLUB(string, noext, {});
  assertLUB(string, nofunc, {});
  assertLUB(string, defFunc, {});
  assertLUB(string, defStruct, any);
  assertLUB(string, defArray, any);

  assertLUB(stringview_wtf8, stringview_wtf8, stringview_wtf8);
  assertLUB(stringview_wtf8, stringview_wtf16, any);
  assertLUB(stringview_wtf8, stringview_iter, any);
  assertLUB(stringview_wtf8, none, stringview_wtf8);
  assertLUB(stringview_wtf8, noext, {});
  assertLUB(stringview_wtf8, nofunc, {});
  assertLUB(stringview_wtf8, defFunc, {});
  assertLUB(stringview_wtf8, defStruct, any);
  assertLUB(stringview_wtf8, defArray, any);

  assertLUB(stringview_wtf16, stringview_wtf16, stringview_wtf16);
  assertLUB(stringview_wtf16, stringview_iter, any);
  assertLUB(stringview_wtf16, none, stringview_wtf16);
  assertLUB(stringview_wtf16, noext, {});
  assertLUB(stringview_wtf16, nofunc, {});
  assertLUB(stringview_wtf16, defFunc, {});
  assertLUB(stringview_wtf16, defStruct, any);
  assertLUB(stringview_wtf16, defArray, any);

  assertLUB(stringview_iter, stringview_iter, stringview_iter);
  assertLUB(stringview_iter, none, stringview_iter);
  assertLUB(stringview_iter, noext, {});
  assertLUB(stringview_iter, nofunc, {});
  assertLUB(stringview_iter, defFunc, {});
  assertLUB(stringview_iter, defStruct, any);
  assertLUB(stringview_iter, defArray, any);

  assertLUB(none, none, none);
  assertLUB(none, noext, {});
  assertLUB(none, nofunc, {});
  assertLUB(none, defFunc, {});
  assertLUB(none, defStruct, defStruct);
  assertLUB(none, defArray, defArray);

  assertLUB(noext, noext, noext);
  assertLUB(noext, nofunc, {});
  assertLUB(noext, defFunc, {});
  assertLUB(noext, defStruct, {});
  assertLUB(noext, defArray, {});

  assertLUB(nofunc, nofunc, nofunc);
  assertLUB(nofunc, defFunc, defFunc);
  assertLUB(nofunc, defStruct, {});
  assertLUB(nofunc, defArray, {});

  assertLUB(defFunc, defFunc, defFunc);
  assertLUB(defFunc, defStruct, {});
  assertLUB(defFunc, defArray, {});

  assertLUB(defStruct, defStruct, defStruct);
  assertLUB(defStruct, defArray, eq);

  assertLUB(defArray, defArray, defArray);

  Type anyref = Type(any, Nullable);
  Type eqref = Type(eq, Nullable);

  {
    // Nullable and non-nullable references.
    Type nonNullable(any, NonNullable);
    EXPECT_TRUE(Type::isSubType(nonNullable, anyref));
    EXPECT_FALSE(Type::isSubType(anyref, nonNullable));
    EXPECT_TRUE(Type::hasLeastUpperBound(anyref, nonNullable));
    EXPECT_EQ(Type::getLeastUpperBound(anyref, nonNullable), anyref);
  }

  {
    // Immutable array fields are covariant.
    TypeBuilder builder(2);
    builder[0] = Array(Field(anyref, Immutable));
    builder[1] = Array(Field(eqref, Immutable));
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }

  {
    // Depth subtyping
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable)});
    builder[1] = Struct({Field(eqref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }

  {
    // Width subtyping
    TypeBuilder builder(2);
    builder[0] = Struct({Field(anyref, Immutable)});
    builder[1] = Struct({Field(anyref, Immutable), Field(anyref, Immutable)});
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }

  {
    // Nested structs
    TypeBuilder builder(4);
    auto ref0 = builder.getTempRefType(builder[0], Nullable);
    auto ref1 = builder.getTempRefType(builder[1], Nullable);
    builder[0] = Struct({Field(anyref, Immutable)});
    builder[1] = Struct({Field(eqref, Immutable)});
    builder[2] = Struct({Field(ref0, Immutable)});
    builder[3] = Struct({Field(ref1, Immutable)});
    builder[1].subTypeOf(builder[0]);
    builder[3].subTypeOf(builder[2]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[3], built[2]));
  }

  {
    // Recursive structs
    TypeBuilder builder(2);
    auto ref0 = builder.getTempRefType(builder[0], Nullable);
    auto ref1 = builder.getTempRefType(builder[1], Nullable);
    builder[0] = Struct({Field(ref0, Immutable)});
    builder[1] = Struct({Field(ref1, Immutable)});
    builder[1].subTypeOf(builder[0]);
    auto results = builder.build();
    ASSERT_TRUE(results);
    auto built = *results;
    EXPECT_TRUE(HeapType::isSubType(built[1], built[0]));
  }
}